

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O2

void __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::removeValue(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
              *this,Node *node,Node **value)

{
  float *pfVar1;
  long *plVar2;
  _Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
  _Var3;
  long *plVar4;
  long lVar5;
  long lVar6;
  long *plVar7;
  
  plVar4 = *(long **)&this[1].mBox;
  plVar2 = *(long **)&this[1].mBox.width;
  lVar5 = (long)plVar2 - (long)plVar4;
  _Var3.
  super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
  ._M_head_impl =
       (node->children)._M_elems[0]._M_t.
       super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
       ._M_t.
       super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
       .
       super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
  ;
  for (lVar6 = lVar5 >> 5; 0 < lVar6; lVar6 = lVar6 + -1) {
    plVar7 = plVar4;
    if (_Var3.
        super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
        ._M_head_impl == (Node *)*plVar4) goto LAB_00101eee;
    if (_Var3.
        super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
        ._M_head_impl == (Node *)plVar4[1]) {
      plVar7 = plVar4 + 1;
      goto LAB_00101eee;
    }
    if (_Var3.
        super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
        ._M_head_impl == (Node *)plVar4[2]) {
      plVar7 = plVar4 + 2;
      goto LAB_00101eee;
    }
    if (_Var3.
        super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
        ._M_head_impl == (Node *)plVar4[3]) {
      plVar7 = plVar4 + 3;
      goto LAB_00101eee;
    }
    plVar4 = plVar4 + 4;
    lVar5 = lVar5 + -0x20;
  }
  lVar5 = lVar5 >> 3;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      plVar7 = plVar2;
      if ((lVar5 != 3) ||
         (plVar7 = plVar4,
         _Var3.
         super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
         ._M_head_impl == (Node *)*plVar4)) goto LAB_00101eee;
      plVar4 = plVar4 + 1;
    }
    plVar7 = plVar4;
    if (_Var3.
        super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
        ._M_head_impl == (Node *)*plVar4) goto LAB_00101eee;
    plVar4 = plVar4 + 1;
  }
  plVar7 = plVar4;
  if (_Var3.
      super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
      ._M_head_impl != (Node *)*plVar4) {
    plVar7 = plVar2;
  }
LAB_00101eee:
  *plVar7 = plVar2[0xffffffffffffffff];
  pfVar1 = &this[1].mBox.width;
  *(long *)pfVar1 = *(long *)pfVar1 + -8;
  return;
}

Assistant:

void removeValue(Node* node, const T& value)
    {
        // Find the value in node->values
        auto it = std::find_if(std::begin(node->values), std::end(node->values),
            [this, &value](const auto& rhs){ return mEqual(value, rhs); });
        assert(it != std::end(node->values) && "Trying to remove a value that is not present in the node");
        // Swap with the last element and pop back
        *it = std::move(node->values.back());
        node->values.pop_back();
    }